

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O2

double __thiscall MeshDenoisingBase::getAverageEdgeLength(MeshDenoisingBase *this,TriMesh *mesh)

{
  undefined8 uVar1;
  Scalar SVar2;
  undefined1 auVar3 [16];
  EdgeIter EVar4;
  undefined1 local_30 [8];
  EdgeIter e_it;
  
  _local_30 = OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)mesh);
  e_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
  e_it.skip_bits_ = 0;
  while( true ) {
    EVar4 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)mesh);
    if ((BaseHandle)e_it.mesh_._0_4_ == EVar4.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
        local_30 == (undefined1  [8])EVar4.mesh_) break;
    SVar2 = OpenMesh::
            PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            ::calc_edge_length((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                *)mesh,(EdgeHandle)e_it.mesh_._0_4_);
    e_it._8_8_ = (double)e_it._8_8_ + SVar2;
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                  *)local_30,0);
  }
  uVar1 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x20))(mesh);
  auVar3._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar3._0_8_ = uVar1;
  auVar3._12_4_ = 0x45300000;
  return (double)e_it._8_8_ /
         ((auVar3._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
}

Assistant:

double MeshDenoisingBase::getAverageEdgeLength(TriMesh &mesh)
{
    double average_edge_length = 0.0;
    for(TriMesh::EdgeIter e_it = mesh.edges_begin(); e_it != mesh.edges_end(); e_it++)
        average_edge_length += mesh.calc_edge_length(*e_it);
    double edgeNum = (double)mesh.n_edges();
    average_edge_length /= edgeNum;

    return average_edge_length;
}